

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::CheckVulkanMemoryModelDeprecatedDecorations
          (ValidationState_t *vstate)

{
  Instruction *this;
  bool bVar1;
  MemoryModel MVar2;
  uint32_t id_00;
  Decoration DVar3;
  unordered_map<unsigned_int,_spvtools::val::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>_>
  *this_00;
  reference pvVar4;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *this_01;
  ostream *poVar5;
  DiagnosticStream *this_02;
  char *local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  DiagnosticStream local_400;
  string local_228;
  int local_204;
  reference pDStack_200;
  int member;
  Decoration *dec;
  iterator __end3;
  iterator __begin3;
  set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
  *__range3;
  uint32_t id;
  Instruction *inst;
  value_type *def;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<unsigned_int,_spvtools::val::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>_>
  *__range2;
  ostringstream str;
  string local_38 [8];
  string msg;
  ValidationState_t *vstate_local;
  
  msg.field_2._8_8_ = vstate;
  MVar2 = ValidationState_t::memory_model(vstate);
  if (MVar2 == MemoryModelVulkan) {
    std::__cxx11::string::string(local_38);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&__range2,local_38,0x10);
    this_00 = ValidationState_t::all_definitions((ValidationState_t *)msg.field_2._8_8_);
    __end2 = std::
             unordered_map<unsigned_int,_spvtools::val::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>_>
             ::begin(this_00);
    def = (value_type *)
          std::
          unordered_map<unsigned_int,_spvtools::val::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>_>
          ::end(this_00);
    while( true ) {
      bVar1 = std::__detail::operator!=
                        (&__end2.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                         ,(_Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                           *)&def);
      if (!bVar1) break;
      pvVar4 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false,_false>
               ::operator*(&__end2);
      this = pvVar4->second;
      id_00 = Instruction::id(this);
      this_01 = ValidationState_t::id_decorations((ValidationState_t *)msg.field_2._8_8_,id_00);
      __end3 = std::
               set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
               ::begin(this_01);
      dec = (Decoration *)
            std::
            set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>
            ::end(this_01);
      while( true ) {
        bVar1 = std::operator!=(&__end3,(_Self *)&dec);
        if (!bVar1) break;
        pDStack_200 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator*(&__end3);
        local_204 = Decoration::struct_member_index(pDStack_200);
        DVar3 = Decoration::dec_type(pDStack_200);
        if (DVar3 == Coherent) {
LAB_002873b3:
          DVar3 = Decoration::dec_type(pDStack_200);
          if (DVar3 == Coherent) {
            local_430 = "Coherent";
          }
          else {
            local_430 = "Volatile";
          }
          std::operator<<((ostream *)&__range2,local_430);
          poVar5 = std::operator<<((ostream *)&__range2," decoration targeting ");
          ValidationState_t::getIdName_abi_cxx11_
                    (&local_228,(ValidationState_t *)msg.field_2._8_8_,id_00);
          std::operator<<(poVar5,(string *)&local_228);
          std::__cxx11::string::~string((string *)&local_228);
          if (local_204 != -1) {
            poVar5 = std::operator<<((ostream *)&__range2," (member index ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_204);
            std::operator<<(poVar5,")");
          }
          std::operator<<((ostream *)&__range2," is banned when using the Vulkan memory model.");
          ValidationState_t::diag
                    (&local_400,(ValidationState_t *)msg.field_2._8_8_,SPV_ERROR_INVALID_ID,this);
          std::__cxx11::ostringstream::str();
          this_02 = DiagnosticStream::operator<<(&local_400,&local_420);
          vstate_local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(this_02);
          std::__cxx11::string::~string((string *)&local_420);
          DiagnosticStream::~DiagnosticStream(&local_400);
          goto LAB_0028753a;
        }
        DVar3 = Decoration::dec_type(pDStack_200);
        if (DVar3 == DecorationVolatile) goto LAB_002873b3;
        std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&__end3);
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false,_false>
      ::operator++(&__end2);
    }
    vstate_local._4_4_ = SPV_SUCCESS;
LAB_0028753a:
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&__range2);
    std::__cxx11::string::~string(local_38);
  }
  else {
    vstate_local._4_4_ = SPV_SUCCESS;
  }
  return vstate_local._4_4_;
}

Assistant:

spv_result_t CheckVulkanMemoryModelDeprecatedDecorations(
    ValidationState_t& vstate) {
  if (vstate.memory_model() != spv::MemoryModel::VulkanKHR) return SPV_SUCCESS;

  std::string msg;
  std::ostringstream str(msg);
  for (const auto& def : vstate.all_definitions()) {
    const auto inst = def.second;
    const auto id = inst->id();
    for (const auto& dec : vstate.id_decorations(id)) {
      const auto member = dec.struct_member_index();
      if (dec.dec_type() == spv::Decoration::Coherent ||
          dec.dec_type() == spv::Decoration::Volatile) {
        str << (dec.dec_type() == spv::Decoration::Coherent ? "Coherent"
                                                            : "Volatile");
        str << " decoration targeting " << vstate.getIdName(id);
        if (member != Decoration::kInvalidMember) {
          str << " (member index " << member << ")";
        }
        str << " is banned when using the Vulkan memory model.";
        return vstate.diag(SPV_ERROR_INVALID_ID, inst) << str.str();
      }
    }
  }
  return SPV_SUCCESS;
}